

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::Job::GetCommandString_abi_cxx11_(string *__return_storage_ptr__,Job *this)

{
  ostream *poVar1;
  pointer pbVar2;
  pointer pbVar3;
  ostringstream command;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar3 = (this->mExpr).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->mExpr).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (pbVar3 != pbVar2) {
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Job::GetCommandString()
{
    std::ostringstream command;
    std::string        out;

    for_each(mExpr.begin(), mExpr.end() - 1, [&command](std::string &item) { command << item << " "; });
    out = command.str();
    out.pop_back(); // get rid of trailing space
    return out;
}